

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

string * __thiscall
Fossilize::encode_base64_abi_cxx11_
          (string *__return_storage_ptr__,Fossilize *this,void *data_,size_t size)

{
  void *pvVar1;
  uint uVar2;
  char cVar3;
  void *pvVar4;
  void *local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  local_48 = data_;
  for (pvVar4 = (void *)0x0; pvVar4 < data_; pvVar4 = (void *)((long)pvVar4 + 3)) {
    uVar2 = (uint)(byte)this[(long)pvVar4] << 0x10;
    if ((void *)((long)pvVar4 + 1U) < data_) {
      uVar2 = uVar2 | (uint)(byte)(this + 1)[(long)pvVar4] << 8;
    }
    if ((void *)((long)pvVar4 + 2) < data_) {
      uVar2 = uVar2 | (byte)(this + 2)[(long)pvVar4];
    }
    base64(uVar2 >> 0x12);
    base64(uVar2 >> 0xc & 0x3f);
    base64(uVar2 >> 6 & 0x3f);
    pvVar1 = (void *)0x3;
    if (local_48 < (void *)0x3) {
      pvVar1 = local_48;
    }
    if ((pvVar1 != (void *)0x1) && (pvVar1 != (void *)0x2)) {
      base64(uVar2 & 0x3f);
    }
    cVar3 = (char)__return_storage_ptr__;
    std::__cxx11::string::push_back(cVar3);
    std::__cxx11::string::push_back(cVar3);
    std::__cxx11::string::push_back(cVar3);
    std::__cxx11::string::push_back(cVar3);
    local_48 = (void *)((long)local_48 + -3);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string encode_base64(const void *data_, size_t size)
{
	auto *data = static_cast<const uint8_t *>(data_);
	size_t num_chars = 4 * ((size + 2) / 3);
	std::string ret;
	ret.reserve(num_chars);

	for (size_t i = 0; i < size; i += 3)
	{
		uint32_t code = data[i] << 16;
		if (i + 1 < size)
			code |= data[i + 1] << 8;
		if (i + 2 < size)
			code |= data[i + 2] << 0;

		auto c0 = base64((code >> 18) & 63);
		auto c1 = base64((code >> 12) & 63);
		auto c2 = base64((code >>  6) & 63);
		auto c3 = base64((code >>  0) & 63);

		auto outbytes = std::min(size - i, size_t(3));
		if (outbytes == 1)
		{
			c2 = '=';
			c3 = '=';
		}
		else if (outbytes == 2)
			c3 = '=';

		ret.push_back(c0);
		ret.push_back(c1);
		ret.push_back(c2);
		ret.push_back(c3);
	}

	return ret;
}